

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<roundTripString>::RegisterTests
          (ParameterizedTestSuiteInfo<roundTripString> *this)

{
  pointer psVar1;
  pointer pIVar2;
  code *pcVar3;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  _Alloc_hider name;
  _Alloc_hider value_param;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  pointer pIVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *this_00;
  ostream *poVar10;
  size_type sVar11;
  char *pcVar12;
  undefined4 extraout_var_02;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  undefined4 extraout_var_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  pointer psVar13;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_1e8;
  char *local_1e0;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_1d8;
  pointer local_1d0;
  pointer local_1c8;
  long local_1c0;
  ParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  generator;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  string test_name;
  string test_suite_name;
  string local_108;
  long local_e8;
  string local_e0 [32];
  CodeLocation local_c0;
  string local_98;
  string param_name;
  CodeLocation local_58;
  undefined4 extraout_var_01;
  
  test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
  test_suite_name._M_string_length = 0;
  bVar6 = false;
  test_suite_name.field_2._M_local_buf[0] = '\0';
  test_name._M_dataplus._M_p = (pointer)&test_name.field_2;
  test_name._M_string_length = 0;
  test_name.field_2._M_local_buf[0] = '\0';
  psVar1 = (this->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar13 = (this->tests_).
                 super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar13 != psVar1; psVar13 = psVar13 + 1
      ) {
    pIVar2 = (this->instantiations_).
             super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pIVar9 = (this->instantiations_).
             super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1c8 = psVar13;
    while (pIVar9 != pIVar2) {
      local_1d0 = pIVar9;
      (*(code *)pIVar9->generator)(&generator);
      pcVar3 = (code *)local_1d0->name_func;
      local_1e0 = local_1d0->file;
      iVar8 = local_1d0->line;
      if ((local_1d0->name)._M_string_length == 0) {
        test_suite_name._M_string_length = 0;
        *test_suite_name._M_dataplus._M_p = '\0';
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &test_param_names,&local_1d0->name,"/");
        std::__cxx11::string::operator=((string *)&test_suite_name,(string *)&test_param_names);
        std::__cxx11::string::~string((string *)&test_param_names);
      }
      std::__cxx11::string::append((string *)&test_suite_name);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar7 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
      local_1e8._M_head_impl =
           (ParamIteratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)CONCAT44(extraout_var,iVar7);
      iVar7 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
      local_1d8._M_head_impl =
           (ParamIteratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)CONCAT44(extraout_var_00,iVar7);
      local_1c0 = 0;
      while( true ) {
        bVar5 = ParamIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator!=((ParamIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_1e8,
                             (ParamIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_1d8);
        if (!bVar5) break;
        iVar7 = (*(local_1e8._M_head_impl)->_vptr_ParamIteratorInterface[5])();
        this_00 = (string *)CONCAT44(extraout_var_01,iVar7);
        test_name._M_string_length = 0;
        *test_name._M_dataplus._M_p = '\0';
        std::__cxx11::string::string((string *)&local_108,this_00);
        local_e8 = local_1c0;
        (*pcVar3)(&param_name,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        bVar6 = IsValidParamName(&param_name);
        bVar6 = IsTrue(bVar6);
        if (!bVar6) {
          GTestLog::GTestLog((GTestLog *)&local_108,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x247);
          poVar10 = std::operator<<((ostream *)&std::cerr,
                                    "Condition IsValidParamName(param_name) failed. ");
          poVar10 = std::operator<<(poVar10,"Parameterized test name \'");
          poVar10 = std::operator<<(poVar10,(string *)&param_name);
          poVar10 = std::operator<<(poVar10,
                                    "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                                   );
          poVar10 = std::operator<<(poVar10,local_1e0);
          poVar10 = std::operator<<(poVar10," line ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar8);
          poVar10 = std::operator<<(poVar10,"");
          std::endl<char,std::char_traits<char>>(poVar10);
          GTestLog::~GTestLog((GTestLog *)&local_108);
        }
        sVar11 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&test_param_names,&param_name);
        bVar6 = IsTrue(sVar11 == 0);
        if (!bVar6) {
          GTestLog::GTestLog((GTestLog *)&local_108,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x24d);
          poVar10 = std::operator<<((ostream *)&std::cerr,
                                    "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar10 = std::operator<<(poVar10,"Duplicate parameterized test name \'");
          poVar10 = std::operator<<(poVar10,(string *)&param_name);
          poVar10 = std::operator<<(poVar10,"\', in ");
          poVar10 = std::operator<<(poVar10,local_1e0);
          poVar10 = std::operator<<(poVar10," line ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar8);
          std::endl<char,std::char_traits<char>>(poVar10);
          GTestLog::~GTestLog((GTestLog *)&local_108);
        }
        if ((((psVar13->
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->test_base_name)._M_string_length != 0) {
          pcVar12 = (char *)std::__cxx11::string::append((string *)&test_name);
          std::__cxx11::string::append(pcVar12);
        }
        std::__cxx11::string::append((string *)&test_name);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&test_param_names,&param_name);
        std::__cxx11::string::string((string *)&local_98,(string *)&test_suite_name);
        name = test_name._M_dataplus;
        PrintToString<std::__cxx11::string>(&local_108,(testing *)this_00,value);
        value_param._M_p = local_108._M_dataplus._M_p;
        CodeLocation::CodeLocation
                  (&local_58,
                   &((psVar13->
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->code_location);
        iVar7 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [3])(this);
        set_up_tc = SuiteApiResolver<roundTripString>::GetSetUpCaseOrSuite(local_1e0,iVar8);
        tear_down_tc = SuiteApiResolver<roundTripString>::GetTearDownCaseOrSuite(local_1e0,iVar8);
        _Var4.
        super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
        ._M_head_impl =
             (((local_1c8->
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->test_meta_factory)._M_t.
             super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .
             super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
        ;
        std::__cxx11::string::string(local_e0,this_00);
        factory = (TestFactoryBase *)
                  (**(code **)(*(long *)_Var4.
                                        super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                                        ._M_head_impl + 0x10))
                            (_Var4.
                             super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                             ._M_head_impl,local_e0);
        MakeAndRegisterTestInfo
                  (&local_98,name._M_p,(char *)0x0,value_param._M_p,&local_58,
                   (TypeId)CONCAT44(extraout_var_02,iVar7),set_up_tc,tear_down_tc,factory);
        std::__cxx11::string::~string(local_e0);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_98);
        local_1c0 = local_1c0 + 1;
        std::__cxx11::string::~string((string *)&param_name);
        bVar6 = true;
        (*(local_1e8._M_head_impl)->_vptr_ParamIteratorInterface[3])();
        psVar13 = local_1c8;
      }
      if (local_1d8._M_head_impl !=
          (ParamIteratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0) {
        (*(local_1d8._M_head_impl)->_vptr_ParamIteratorInterface[1])();
      }
      if (local_1e8._M_head_impl !=
          (ParamIteratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0) {
        (*(local_1e8._M_head_impl)->_vptr_ParamIteratorInterface[1])();
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&test_param_names._M_t);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&generator.impl_.
                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      pIVar9 = local_1d0 + 1;
    }
  }
  if (!bVar6) {
    iVar8 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                      (this);
    CodeLocation::CodeLocation(&local_c0,&this->code_location_);
    InsertSyntheticTestCase
              ((string *)CONCAT44(extraout_var_03,iVar8),&local_c0,
               (this->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (this->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  std::__cxx11::string::~string((string *)&test_name);
  std::__cxx11::string::~string((string *)&test_suite_name);
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }